

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O2

void slang::mul(uint64_t *dst,uint64_t *x,uint32_t xlen,uint64_t *y,uint32_t ylen)

{
  ulong *puVar1;
  uint64_t *dst_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  unsigned_long *puVar5;
  uint ylen_00;
  uint64_t uVar6;
  ulong uVar7;
  uint32_t xlen_00;
  ulong uVar8;
  uint64_t *y_00;
  uint ylen_01;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint32_t uVar12;
  uint32_t len;
  TempBuffer<unsigned_long,_128UL> t2;
  TempBuffer<unsigned_long,_128UL> t1;
  TempBuffer<unsigned_long,_128UL> local_440;
  
  uVar9 = (ulong)xlen;
  if (ylen < 8 || xlen < 8) {
    uVar6 = mulOne(dst,x,xlen,*y);
    dst[uVar9] = uVar6;
    for (uVar10 = 1; uVar10 < ylen; uVar10 = uVar10 + 1) {
      uVar11 = 0;
      uVar8 = 0;
      while( true ) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar8;
        if (uVar9 == uVar11) break;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = y[uVar10];
        auVar3._8_8_ = 0;
        auVar3._0_8_ = x[uVar11];
        auVar4 = auVar2 * auVar3 + auVar4;
        uVar7 = auVar4._0_8_;
        puVar1 = dst + (uint)((int)uVar10 + (int)uVar11);
        uVar8 = *puVar1;
        *puVar1 = *puVar1 + uVar7;
        uVar8 = auVar4._8_8_ + (ulong)CARRY8(uVar8,uVar7);
        uVar11 = uVar11 + 1;
      }
      dst[(int)uVar10 + xlen] = uVar8;
    }
  }
  else {
    y_00 = x;
    uVar12 = ylen;
    if (xlen <= ylen) {
      uVar9 = (ulong)ylen;
      y_00 = y;
      y = x;
      uVar12 = xlen;
    }
    uVar10 = uVar9 >> 1;
    ylen_00 = (uint)uVar10;
    uVar8 = (ulong)uVar12;
    if (ylen_00 < uVar12) {
      uVar8 = uVar10;
    }
    xlen_00 = (uint32_t)uVar8;
    uVar12 = uVar12 - xlen_00;
    ylen_01 = (uint)uVar9 - ylen_00;
    uVar11 = (ulong)(ylen + xlen);
    TempBuffer<unsigned_long,_128UL>::TempBuffer(&t1,uVar11);
    memset(t1.ptr,0,t1.size << 3);
    mul(t1.ptr,y + uVar8,uVar12,y_00 + uVar10,ylen_01);
    memset(dst,0,uVar11 * 8);
    memcpy(dst + ((uint)uVar9 & 0xfffffffe),t1.ptr,(ulong)(uVar12 + ylen_01) << 3);
    TempBuffer<unsigned_long,_128UL>::TempBuffer(&t2,uVar11);
    memset(t2.ptr,0,t2.size << 3);
    mul(t2.ptr,y,xlen_00,y_00,ylen_00);
    puVar5 = t2.ptr;
    memcpy(dst,t2.ptr,(ulong)(xlen_00 + ylen_00) << 3);
    len = (ylen + xlen) - ylen_00;
    dst_00 = dst + uVar10;
    subGeneral(dst_00,dst_00,puVar5,len);
    puVar5 = t1.ptr;
    subGeneral(dst_00,dst_00,t1.ptr,len);
    memset(puVar5,0,t1.size << 3);
    unevenAdd(t1.ptr,y + uVar8,uVar12,y,xlen_00);
    memset(t2.ptr,0,t2.size << 3);
    unevenAdd(t2.ptr,y_00 + uVar10,ylen_01,y_00,ylen_00);
    TempBuffer<unsigned_long,_128UL>::TempBuffer(&local_440,uVar11);
    memset(local_440.ptr,0,local_440.size << 3);
    if (uVar12 < xlen_00) {
      uVar12 = xlen_00;
    }
    if (ylen_01 < ylen_00) {
      ylen_01 = ylen_00;
    }
    mul(local_440.ptr,t1.ptr,uVar12 + 1,t2.ptr,ylen_01 + 1);
    addGeneral(dst_00,dst_00,local_440.ptr,len);
    TempBuffer<unsigned_long,_128UL>::~TempBuffer(&local_440);
    TempBuffer<unsigned_long,_128UL>::~TempBuffer(&t2);
    TempBuffer<unsigned_long,_128UL>::~TempBuffer(&t1);
  }
  return;
}

Assistant:

static void mul(uint64_t* dst, const uint64_t* x, uint32_t xlen, const uint64_t* y, uint32_t ylen) {
    if (xlen > 7 && ylen > 7) {
        mulKaratsuba(dst, x, xlen, y, ylen);
        return;
    }

    dst[xlen] = mulOne(dst, x, xlen, y[0]);
    for (uint32_t i = 1; i < ylen; i++) {
        uint64_t carry = 0;
        for (uint32_t j = 0; j < xlen; j++) {
            calc_out_t result;
            uint8_t c = addcarry64(0, mulTerm(x[j], y[i], carry), dst[i + j], &result);

            dst[i + j] = result;
            carry += c;
        }
        dst[i + xlen] = carry;
    }
}